

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_p.h
# Opt level: O2

int zng_tr_tally_lit(deflate_state *s,uchar c)

{
  uint uVar1;
  undefined3 in_register_00000031;
  
  uVar1 = s->sym_next;
  s->d_buf[uVar1] = 0;
  s->sym_next = uVar1 + 1;
  s->l_buf[uVar1] = c;
  s->dyn_ltree[CONCAT31(in_register_00000031,c)].fc.freq =
       s->dyn_ltree[CONCAT31(in_register_00000031,c)].fc.freq + 1;
  return (int)(s->sym_next == s->sym_end);
}

Assistant:

static inline int zng_tr_tally_lit(deflate_state *s, unsigned char c) {
    /* c is the unmatched char */
#ifdef LIT_MEM
    s->d_buf[s->sym_next] = 0;
    s->l_buf[s->sym_next++] = c;
#else
    s->sym_buf[s->sym_next++] = 0;
    s->sym_buf[s->sym_next++] = 0;
    s->sym_buf[s->sym_next++] = c;
#endif
    s->dyn_ltree[c].Freq++;
    Tracevv((stderr, "%c", c));
    Assert(c <= (STD_MAX_MATCH-STD_MIN_MATCH), "zng_tr_tally: bad literal");
    return (s->sym_next == s->sym_end);
}